

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void t1_destroy(opj_t1_t *t1)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    mqc_destroy((opj_mqc_t *)0x2d75a9);
    raw_destroy((opj_raw_t *)0x2d75b6);
    free(*(void **)((long)in_RDI + 0x18));
    free(*(void **)((long)in_RDI + 0x20));
    free(in_RDI);
  }
  return;
}

Assistant:

void t1_destroy(opj_t1_t *t1) {
	if(t1) {
		/* destroy MQC and RAW handles */
		mqc_destroy(t1->mqc);
		raw_destroy(t1->raw);
		opj_aligned_free(t1->data);
		opj_aligned_free(t1->flags);
		opj_free(t1);
	}
}